

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modl.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  FILE *ctx;
  int option_index;
  char output_filename [8192];
  char local_2038 [8200];
  
  option_index = 0;
  if (argc < 2) {
    show_options(argv);
  }
  else {
    pcVar2 = (char *)0x0;
    while( true ) {
      ctx = (FILE *)(ulong)(uint)argc;
      iVar1 = getopt_long(ctx,argv,":vho:",long_options,&option_index);
      if (iVar1 != 0x6f) break;
      pcVar2 = strdup(_optarg);
    }
    if (iVar1 != -1) {
      if (iVar1 == 0x3a) {
        pcVar2 = *argv;
        pcVar4 = "%s: option \'-%c\' requires an argument\n";
      }
      else {
        if (iVar1 == 0x68) {
          show_options(argv);
LAB_0010ef44:
          exit(0);
        }
        if (iVar1 == 0x76) {
          puts(nmodl_version_);
          goto LAB_0010ef44;
        }
        pcVar2 = *argv;
        pcVar4 = "%s: invalid option `-%c\' \n";
      }
      fprintf(_stderr,pcVar4,pcVar2,(ulong)_optopt);
      iVar1 = -1;
      goto LAB_0010ef98;
    }
    if (1 < argc - _optind) {
      ctx = _stderr;
      fprintf(_stderr,
              "%s: Warning several input files specified on command line but only one will be processed\n"
              ,*argv);
    }
    init((EVP_PKEY_CTX *)ctx);
    pcVar4 = argv[_optind];
    finname = pcVar4;
    modprefix = strdup(pcVar4);
    pcVar3 = strrchr(modprefix,0x2e);
    strcpy(local_2038,pcVar4);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
    }
    fin = (FILE *)fopen(local_2038,"r");
    if ((FILE *)fin == (FILE *)0x0) {
      sprintf(local_2038,"%s.mod",pcVar4);
      sprintf(finname,"%s.mod",pcVar4);
      fin = (FILE *)fopen(local_2038,"r");
      if ((FILE *)fin == (FILE *)0x0) {
        diag("Can\'t open input file: ",local_2038);
      }
    }
    if (pcVar2 == (char *)0x0) {
      sprintf(output_filename,"%s.cpp",modprefix);
LAB_0010ee19:
      fcout = (FILE *)fopen(output_filename,"w");
      if ((FILE *)fcout != (FILE *)0x0) {
        fprintf(_stderr,"Translating %s into %s\n",local_2038,output_filename);
        yyparse();
        solvhandler();
        consistency();
        chk_thread_safe();
        parout();
        c_out();
        fclose((FILE *)fcout);
        free_global_variables();
        if (vectorize != 0) {
          fwrite("Thread Safe\n",0xc,1,_stderr);
        }
        if (usederivstatearray != 0) {
          fwrite("Derivatives of STATE array variables are not translated correctly and compile time errors will be generated.\n"
                 ,0x6d,1,_stderr);
          fprintf(_stderr," %s.c file may be manually edited to fix these errors.\n",modprefix);
        }
        return 0;
      }
      diag("Can\'t create C file: ",output_filename);
    }
    iVar1 = mkdir_p(pcVar2);
    pcVar4 = modprefix;
    if (iVar1 == 0) {
      pcVar3 = strrchr(modprefix,0x2f);
      if (pcVar3 == (char *)0x0) {
        pcVar3 = pcVar4;
      }
      sprintf(output_filename,"%s%s.cpp",pcVar2,pcVar3);
      goto LAB_0010ee19;
    }
    fprintf(_stderr,"Can\'t create output directory %s\n",pcVar2);
  }
  iVar1 = 1;
LAB_0010ef98:
  exit(iVar1);
}

Assistant:

int main(int argc, char** argv) {
  int option        = -1;
  int option_index  = 0;
  char* output_dir = NULL;

  if (argc < 2) {
    show_options(argv);
    exit(1);
  }

  while ( (option = getopt_long (argc, argv, ":vho:", long_options, &option_index)) != -1) {
    switch (option) {
      case 'v':
        printf("%s\n", nmodl_version_);
        exit(0);

      case 'o':
        output_dir = strdup(optarg);
        break;

      case 'h':
        show_options(argv);
        exit(0);

      case ':':
        fprintf(stderr, "%s: option '-%c' requires an argument\n", argv[0], optopt);
        exit (-1);

      case '?':
      default:
        fprintf(stderr, "%s: invalid option `-%c' \n", argv[0], optopt);
        exit (-1);
    }
  }
  if ((argc - optind) > 1) {
    fprintf(stderr, "%s: Warning several input files specified on command line but only one will be processed\n", argv[0]);
  }

  init(); /* keywords into symbol table, initialize lists, etc. */
  finname = argv[optind];
  openfiles(finname, output_dir); /* .mrg else .mod,  .var, .c */
  IGNORE(yyparse());
/*
 * At this point all blocks are fully processed except the kinetic
 * block and the solve statements. Even in these cases the 
 * processing doesn't involve syntax since the information is
 * held in intermediate lists of specific structure.
 *
 */
/*
 * go through the list of solve statements and construct the model()
 * code 
 */
  solvhandler();
/* 
 * NAME's can be used in many cases before they were declared and
 * no checking up to this point has been done to make sure that
 * names have been used in only one way.
 *
 */
  consistency();
  chk_thread_safe();
  parout();
  c_out();   /* print .c file */

  IGNORE(fclose(fcout));

  free_global_variables();

#if NMODL && VECTORIZE
  if (vectorize) {
    Fprintf(stderr, "Thread Safe\n");
  }
  if (usederivstatearray) {
    fprintf(stderr, "Derivatives of STATE array variables are not translated correctly and compile time errors will be generated.\n");
    fprintf(stderr, " %s.c file may be manually edited to fix these errors.\n", modprefix);
  }
#endif

#if LINT
{ /* for lex */
  extern int      yytchar, yylineno;
  extern FILE    *yyin;
  IGNORE(yyin);
  IGNORE(yytchar);
  IGNORE(yylineno);
  IGNORE(yyinput());
  yyunput(ilint);
  yyoutput(ilint);
}
#endif
  return 0;
}